

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall phyr::Film::addSplat(Film *this,Point2f *pt,Spectrum *spec)

{
  bool bVar1;
  SampledSpectrum *in_RDX;
  Point2<double> *in_RSI;
  Point2i *in_RDI;
  Pixel *pixel;
  double xyz [3];
  Point2i p;
  double in_stack_000000f8;
  AtomicReal *in_stack_00000100;
  Film *in_stack_ffffffffffffffc0;
  double local_38 [3];
  Point2<int> local_20;
  SampledSpectrum *local_18;
  
  local_18 = in_RDX;
  Point2<int>::Point2<double>(&local_20,in_RSI);
  bVar1 = insideExclusive<int>(&local_20,(Bounds2<int> *)(in_RDI + 7));
  if (bVar1) {
    SampledSpectrum::toXYZConstants(local_18,local_38);
    getPixel(in_stack_ffffffffffffffc0,in_RDI);
    AtomicReal::add(in_stack_00000100,in_stack_000000f8);
    AtomicReal::add(in_stack_00000100,in_stack_000000f8);
    AtomicReal::add(in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void Film::addSplat(const Point2f& pt, const Spectrum& spec) {
#ifndef PHYRAY_OPTIMIZE
    // Ignore invalid spectrum data
    if (spec.hasNaNs()) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) due to NaN value", pt.x, pt.y);
        return;
    }

    if (spec.getYConstant() < 0) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) with negative luminance", pt.x, pt.y);
        return;
    }

    if (std::isinf(spec.getYConstant())) {
        LOG_WARNING_FMT("Ignoring splat at (%f, %f) with infinite luminance", pt.x, pt.y);
        return;
    }
#endif

    Point2i p(pt);
    if (!insideExclusive(p, croppedImageBounds)) return;

    // Get xyz contributions
    Real xyz[3];
    spec.toXYZConstants(xyz);
    // Add as splat to pixel
    Pixel& pixel = getPixel(p);
    pixel.splatXYZ[0].add(xyz[0]); pixel.splatXYZ[1].add(xyz[1]);
    pixel.splatXYZ[2].add(xyz[2]);
}